

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void GEO::CmdLine::declare_arg
               (string *name,ArgType type,string *default_value,string *description,ArgFlags flags)

{
  _Link_type __x;
  _Link_type __k;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  iterator iVar6;
  ostream *poVar7;
  iterator iVar8;
  _Rb_tree_node_base *this;
  _Base_ptr p_Var9;
  byte extraout_var;
  Environment *pEVar10;
  long lVar11;
  iterator iVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__k_00;
  iterator iVar13;
  _Link_type __p;
  _Link_type p_Var14;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar15;
  Arg arg;
  string group;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  undefined8 local_90;
  undefined1 local_88 [24];
  string local_70;
  key_type local_50;
  
  iVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
          ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
                  *)(::(anonymous_namespace)::desc_ + 0x20),name);
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  if (iVar6._M_node != (_Base_ptr)(::(anonymous_namespace)::desc_ + 0x28)) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"CmdLine","");
    poVar7 = Logger::err(&local_b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Argument is multiply defined: ",0x1e)
    ;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == paVar1) {
      return;
    }
    goto LAB_0013182f;
  }
  __k_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_90 = 0;
  local_88[0] = 0;
  local_98 = __k_00;
  std::__cxx11::string::_M_assign((string *)&local_b8);
  local_88._16_4_ = type;
  std::__cxx11::string::_M_assign((string *)&local_98);
  lVar11 = ::(anonymous_namespace)::desc_;
  __x = (_Link_type)(::(anonymous_namespace)::desc_ + 0x28);
  local_88._20_4_ = flags;
  iVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
          ::_M_lower_bound(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
                             **)(::(anonymous_namespace)::desc_ + 0x30),__x,(_Base_ptr)name,__k_00);
  if (((_Link_type)iVar8._M_node == __x) ||
     (iVar5 = std::__cxx11::string::compare((string *)name), iVar5 < 0)) {
    this = (_Rb_tree_node_base *)operator_new(0x88);
    __k = (_Link_type)(this + 1);
    *(_Base_ptr **)(this + 1) = &this[1]._M_left;
    pcVar2 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)__k,pcVar2,pcVar2 + name->_M_string_length);
    *(undefined8 *)(this + 2) = 0;
    this[2]._M_parent = (_Base_ptr)0x0;
    this[2]._M_left = (_Base_ptr)0x0;
    this[2]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(this + 3) = 0;
    this[3]._M_parent = (_Base_ptr)0x0;
    this[3]._M_left = (_Base_ptr)0x0;
    this[3]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(this + 4) = 0;
    *(_Base_ptr **)(this + 2) = &this[2]._M_left;
    this[2]._M_parent = (_Base_ptr)0x0;
    *(undefined1 *)&this[2]._M_left = 0;
    *(_Base_ptr **)(this + 3) = &this[3]._M_left;
    this[3]._M_parent = (_Base_ptr)0x0;
    *(undefined1 *)&this[3]._M_left = 0;
    if ((_Link_type)iVar8._M_node == __x) {
      if ((*(long *)(lVar11 + 0x48) == 0) ||
         (__p = __k,
         iVar5 = std::__cxx11::string::compare((string *)(*(long *)(lVar11 + 0x40) + 0x20)),
         -1 < iVar5)) {
LAB_00131a09:
        __p = __k;
        pVar15 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
                 ::_M_get_insert_unique_pos
                           ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
                             *)(lVar11 + 0x20),(key_type *)__k);
      }
      else {
        p_Var9 = *(_Base_ptr *)(lVar11 + 0x40);
LAB_00131a1e:
        auVar3._8_8_ = 0;
        auVar3._0_8_ = p_Var9;
        pVar15 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar3 << 0x40);
      }
    }
    else {
      __p = (_Link_type)(iVar8._M_node + 1);
      iVar5 = std::__cxx11::string::compare((string *)__k);
      if (iVar5 < 0) {
        p_Var9 = *(_Base_ptr *)(lVar11 + 0x38);
        pVar15.second = p_Var9;
        pVar15.first = p_Var9;
        if (p_Var9 != iVar8._M_node) {
          p_Var9 = (_Base_ptr)std::_Rb_tree_decrement(iVar8._M_node);
          __p = __k;
          iVar5 = std::__cxx11::string::compare((string *)(p_Var9 + 1));
          if (-1 < iVar5) goto LAB_00131a09;
          iVar13 = iVar8;
          if (p_Var9->_M_right == (_Base_ptr)0x0) {
            iVar13._M_node = (_Base_ptr)0x0;
            iVar8._M_node = p_Var9;
          }
LAB_00131a31:
          pVar15.second = iVar8._M_node;
          pVar15.first = iVar13._M_node;
        }
      }
      else {
        __p = __k;
        iVar5 = std::__cxx11::string::compare((string *)(iVar8._M_node + 1));
        if (iVar5 < 0) {
          p_Var9 = *(_Base_ptr *)(lVar11 + 0x40);
          if (p_Var9 == iVar8._M_node) goto LAB_00131a1e;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(iVar8._M_node);
          __p = (_Link_type)(p_Var9 + 1);
          iVar5 = std::__cxx11::string::compare((string *)__k);
          if (iVar5 < 0) {
            iVar13._M_node = (iVar8._M_node)->_M_right;
            if ((iVar8._M_node)->_M_right != (_Base_ptr)0x0) {
              iVar13._M_node = p_Var9;
              iVar8._M_node = p_Var9;
            }
            goto LAB_00131a31;
          }
          goto LAB_00131a09;
        }
        pVar15.second = (_Rb_tree_node_base *)0x0;
        pVar15.first = iVar8._M_node;
      }
    }
    p_Var14 = (_Link_type)pVar15.second;
    iVar8._M_node = pVar15.first;
    if (p_Var14 == (_Link_type)0x0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
      ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
                      *)this,__p);
    }
    else {
      bVar4 = true;
      if ((iVar8._M_node == (_Base_ptr)0x0) && (__x != p_Var14)) {
        std::__cxx11::string::compare((string *)__k);
        bVar4 = (bool)(extraout_var >> 7);
      }
      std::_Rb_tree_insert_and_rebalance
                (bVar4,this,(_Rb_tree_node_base *)p_Var14,(_Rb_tree_node_base *)__x);
      *(long *)(lVar11 + 0x48) = *(long *)(lVar11 + 0x48) + 1;
      iVar8._M_node = this;
    }
  }
  std::__cxx11::string::_M_assign((string *)(iVar8._M_node + 2));
  std::__cxx11::string::_M_assign((string *)(iVar8._M_node + 3));
  *(ulong *)(iVar8._M_node + 4) = CONCAT44(local_88._20_4_,local_88._16_4_);
  pEVar10 = Environment::instance();
  (*(pEVar10->super_Counted)._vptr_Counted[4])(pEVar10,name,default_value);
  lVar11 = std::__cxx11::string::find((char)name,0x3a);
  if (lVar11 == -1) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50.field_2._M_allocated_capacity._0_4_ = 0x626f6c67;
    local_50.field_2._M_allocated_capacity._4_2_ = 0x6c61;
    local_50._M_string_length = 6;
    local_50.field_2._M_local_buf[6] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)name);
  }
  iVar12 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Group>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Group>_>_>
                   *)(::(anonymous_namespace)::desc_ + 0x50),&local_50);
  if (iVar12._M_node == (_Base_ptr)(::(anonymous_namespace)::desc_ + 0x58)) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_88 + 0x18),"CmdLine","");
    poVar7 = Logger::err((string *)(local_88 + 0x18));
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"Argument group does not exist: ",0x1f);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&iVar12._M_node[4]._M_parent,name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88) {
    operator_delete(local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
    return;
  }
LAB_0013182f:
  operator_delete(local_b8._M_dataplus._M_p);
  return;
}

Assistant:

void declare_arg(
            const std::string& name,
            ArgType type,
            const std::string& default_value,
            const std::string& description,
            ArgFlags flags
        ) {
            if(desc_->args.find(name) != desc_->args.end()) {
                Logger::err("CmdLine")
                    << "Argument is multiply defined: " << name
                    << std::endl;
                return;
            }

            Arg arg;
            arg.name = name;
            arg.type = type;
            arg.desc = description;
            arg.flags = flags;
            desc_->args[name] = arg;

            Environment::instance()->set_value(name, default_value);

            std::string group = arg_group(name);
            auto it = desc_->groups.find(group);
            if(it == desc_->groups.end()) {
                Logger::err("CmdLine")
                    << "Argument group does not exist: " << name
                    << std::endl;
                return;
            }

            it->second.args.push_back(name);
        }